

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O3

void __thiscall SQVM::Push(SQVM *this,SQObjectPtr *o)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectType SVar3;
  SQObjectPtr *pSVar4;
  long lVar5;
  SQTable *pSVar6;
  SQTable *pSVar7;
  
  pSVar4 = (this->_stack)._vals;
  lVar5 = this->_top;
  this->_top = lVar5 + 1;
  SVar2 = pSVar4[lVar5].super_SQObject._type;
  pSVar6 = pSVar4[lVar5].super_SQObject._unVal.pTable;
  pSVar7 = (o->super_SQObject)._unVal.pTable;
  pSVar4[lVar5].super_SQObject._unVal.pTable = pSVar7;
  SVar3 = (o->super_SQObject)._type;
  pSVar4[lVar5].super_SQObject._type = SVar3;
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
      return;
    }
  }
  return;
}

Assistant:

inline T& operator[](SQUnsignedInteger pos) const{ return _vals[pos]; }